

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_readwrite(connectdata *conn,Curl_easy *data,_Bool *done,_Bool *comeback)

{
  ulong uVar1;
  int *piVar2;
  long *plVar3;
  char **ppcVar4;
  char cVar5;
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var6;
  contenc_writer *writer;
  curl_off_t *pcVar7;
  curl_off_t cVar8;
  void *pvVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  _Bool _Var18;
  CURLcode CVar19;
  CHUNKcode code;
  int iVar20;
  CURLcode CVar21;
  size_t sVar22;
  long lVar23;
  char *pcVar24;
  timediff_t tVar25;
  size_t sVar26;
  Curl_handler *pCVar27;
  ulong uVar28;
  ulong uVar29;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  char *pcVar30;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  long lVar31;
  ulong extraout_RDX_15;
  ulong extraout_RDX_16;
  ulong extraout_RDX_17;
  ulong extraout_RDX_18;
  ulong extraout_RDX_19;
  ulong extraout_RDX_20;
  ulong extraout_RDX_21;
  ulong extraout_RDX_22;
  ulong uVar32;
  uint uVar33;
  curl_socket_t readfd0;
  ulong nread;
  uint uVar34;
  bool bVar35;
  curltime cVar36;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  _Bool readmore;
  ssize_t bytes_written;
  CURLcode local_64;
  ulong local_60;
  _Bool local_55;
  CHUNKcode local_54;
  _Bool *local_50;
  uint local_44;
  ulong local_40;
  _Bool *local_38;
  
  uVar33 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar34 = (data->req).keepon;
  uVar29 = 0xffffffff;
  readfd0 = -1;
  if ((uVar34 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar34 & 0x2a) == 2) {
    uVar29 = (ulong)(uint)conn->writesockfd;
  }
  uVar33 = uVar33 | (conn->data->state).drain != 0;
  if (uVar33 == 0) {
    uVar33 = Curl_socket_check(readfd0,-1,(curl_socket_t)uVar29,0);
    uVar29 = extraout_RDX;
  }
  if (uVar33 == 4) {
    Curl_failf(data,"select/poll returned error");
    return CURLE_SEND_ERROR;
  }
  nread = 0;
  if ((((data->req).keepon & 1) != 0) &&
     (((uVar33 & 1) != 0 || ((conn->bits).stream_was_rewound == true)))) {
    readmore = false;
    *done = false;
    *comeback = false;
    iVar20 = 100;
    local_60 = local_60 & 0xffffffff00000000;
    local_40 = 0;
    CVar19 = CURLE_OK;
    local_50 = done;
    local_38 = comeback;
    do {
      sVar26 = (data->set).buffer_size;
      lVar23 = (data->req).size;
      if (((lVar23 != -1) && ((data->req).header == false)) &&
         (sVar22 = lVar23 - (data->req).bytecount, (long)sVar22 < (long)sVar26)) {
        sVar26 = sVar22;
      }
      if (sVar26 == 0) {
        bytes_written = 0;
LAB_0012389e:
        if ((((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) &&
           (Curl_pgrsTime(data,TIMER_STARTTRANSFER), uVar29 = extraout_RDX_01,
           (data->req).exp100 != EXP100_SEND_DATA)) {
          cVar36 = Curl_now();
          uVar29 = cVar36._8_8_;
          (data->req).start100.tv_sec = cVar36.tv_sec;
          (data->req).start100.tv_usec = cVar36.tv_usec;
        }
        if (bytes_written == 0) {
          uVar29 = CONCAT71((int7)(uVar29 >> 8),(data->req).bodywrites == 0);
        }
        else {
          uVar29 = 0;
        }
        if (bytes_written < 1 && (uVar29 & 1) == 0) {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
          uVar34 = 2;
LAB_0012396c:
          local_60 = CONCAT44(local_60._4_4_,1);
        }
        else {
          local_44 = (uint)uVar29;
          (data->req).buf[bytes_written] = '\0';
          (data->req).str = (data->req).buf;
          p_Var6 = conn->handler->readwrite;
          if (p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) {
            CVar19 = (*p_Var6)(data,conn,&bytes_written,&readmore);
            local_60 = CONCAT44(local_60._4_4_,1);
            uVar29 = extraout_RDX_02;
            if (CVar19 != CURLE_OK) goto LAB_00123952;
            CVar19 = CURLE_OK;
            uVar34 = 2;
            if (readmore != false) goto LAB_00123974;
          }
          if ((data->req).header == true) {
            local_55 = false;
            CVar21 = Curl_http_readwrite_headers(data,conn,&bytes_written,&local_55);
            local_60 = CONCAT44(local_60._4_4_,1);
            uVar29 = extraout_RDX_04;
            if (CVar21 == CURLE_OK) {
              p_Var6 = conn->handler->readwrite;
              if (((p_Var6 == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)
                              0x0) || (0 < (data->req).maxdownload)) || (bytes_written < 1)) {
LAB_00123a5e:
                if (local_55 == true) {
                  uVar34 = 2;
                  if (0 < bytes_written) {
                    _Var18 = Curl_pipeline_wanted(conn->data->multi,1);
                    if (_Var18) {
                      Curl_infof(data,
                                 "Rewinding stream by : %zd bytes on url %s (zero-length body)\n",
                                 bytes_written);
                      bVar35 = false;
                      conn->read_pos = conn->read_pos - bytes_written;
                      (conn->bits).stream_was_rewound = true;
                      uVar29 = extraout_RDX_06;
                      goto LAB_00123ad7;
                    }
                    Curl_infof(data,
                               "Excess found in a non pipelined read: excess = %zd url = %s (zero-length body)\n"
                               ,bytes_written);
                    uVar29 = extraout_RDX_07;
                  }
                  bVar35 = false;
                }
                else {
                  uVar34 = 0;
                  bVar35 = true;
                }
LAB_00123ad7:
                CVar19 = CURLE_OK;
              }
              else {
                CVar21 = (*p_Var6)(data,conn,&bytes_written,&readmore);
                CVar19 = CURLE_OK;
                uVar29 = extraout_RDX_05;
                if (CVar21 != CURLE_OK) goto LAB_001239fc;
                if (readmore == false) goto LAB_00123a5e;
                uVar34 = 2;
                bVar35 = false;
              }
            }
            else {
LAB_001239fc:
              CVar19 = CVar21;
              bVar35 = false;
              uVar34 = 1;
              local_64 = CVar19;
            }
            if (!bVar35) goto LAB_00123974;
          }
          uVar34 = local_44;
          if ((((data->req).str == (char *)0x0) || ((data->req).header != false)) ||
             (bytes_written < 1 && (local_44 & 1) == 0)) {
LAB_00123b4c:
            p_Var6 = conn->handler->readwrite;
            if (((p_Var6 == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)
                            0x0) || (local_40 == 0)) || ((conn->bits).stream_was_rewound != false))
            {
              if ((char)uVar34 != '\0') {
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
              }
              uVar34 = (uint)(data->req).keepon >> 3 & 2;
              goto LAB_0012396c;
            }
            pcVar24 = (data->req).str + bytes_written;
            (data->req).str = pcVar24;
            pcVar30 = (data->req).buf + (data->set).buffer_size;
            bytes_written = local_40;
            if (pcVar30 < pcVar24 + local_40) {
              bytes_written = (long)pcVar30 - (long)pcVar24;
            }
            local_40 = bytes_written;
            CVar19 = (*p_Var6)(data,conn,&bytes_written,&readmore);
            local_60 = CONCAT44(local_60._4_4_,1);
            uVar29 = extraout_RDX_09;
            if (CVar19 != CURLE_OK) goto LAB_00123952;
            uVar34 = 2;
            CVar19 = CURLE_OK;
            if (readmore == true) {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 | 1;
              CVar19 = CURLE_OK;
            }
          }
          else {
            if ((data->set).opt_no_body == true) {
              Curl_conncontrol(conn,2);
              *local_50 = true;
              local_64 = CURLE_WEIRD_SERVER_REPLY;
              uVar29 = extraout_RDX_08;
LAB_00123b34:
              local_60 = CONCAT44(local_60._4_4_,1);
            }
            else {
              if (((data->req).bodywrites != 0 || (local_44 & 1) != 0) ||
                 ((conn->handler->protocol & 0x40003) == 0)) {
LAB_00123cda:
                plVar3 = &(data->req).bodywrites;
                *plVar3 = *plVar3 + 1;
                if (((data->set).verbose == true) &&
                   (((data->req).badheader == HEADER_NORMAL ||
                    (Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,(data->req).hbuflen),
                    (data->req).badheader == HEADER_PARTHEADER)))) {
                  Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,bytes_written);
                }
                if ((data->req).chunk == true) {
                  code = Curl_httpchunk_read(conn,(data->req).str,bytes_written,&bytes_written);
                  if (code < CHUNKE_TOO_LONG_HEX) {
                    uVar29 = extraout_RDX_10;
                    if (code == CHUNKE_STOP) {
                      piVar2 = &(data->req).keepon;
                      *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                      uVar29 = (conn->chunk).dataleft;
                      if (uVar29 != 0) {
                        local_60 = uVar29;
                        local_54 = code;
                        Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n");
                        _Var18 = Curl_pipeline_wanted(conn->data->multi,1);
                        uVar29 = extraout_RDX_12;
                        code = local_54;
                        if (_Var18) {
                          Curl_infof(conn->data,"Rewinding %zu bytes\n",local_60);
                          conn->read_pos = conn->read_pos - local_60;
                          (conn->bits).stream_was_rewound = true;
                          uVar29 = extraout_RDX_13;
                          code = local_54;
                        }
                      }
                    }
                  }
                  else if (code == CHUNKE_WRITE_ERROR) {
                    local_54 = code;
                    Curl_failf(data,"Failed writing data");
                    local_64 = CURLE_WRITE_ERROR;
                    uVar29 = extraout_RDX_11;
                    code = local_54;
                  }
                  else {
                    local_54 = code;
                    pcVar24 = Curl_chunked_strerror(code);
                    Curl_failf(data,"%s in chunked-encoding",pcVar24);
                    local_64 = CURLE_RECV_ERROR;
                    uVar29 = extraout_RDX_14;
                    code = local_54;
                  }
                  local_60 = CONCAT44(local_60._4_4_,1);
                  if (CHUNKE_OK < code) goto LAB_00123b3c;
                }
                if (((data->req).badheader == HEADER_PARTHEADER) &&
                   ((data->req).ignorebody == false)) {
                  pcVar7 = &(data->req).bytecount;
                  *pcVar7 = *pcVar7 + (data->req).hbuflen;
                }
                lVar23 = (data->req).maxdownload;
                if (lVar23 != -1) {
                  lVar31 = bytes_written + (data->req).bytecount;
                  uVar29 = lVar31 - lVar23;
                  if (lVar23 <= lVar31) {
                    if ((uVar29 != 0) && ((data->req).ignorebody == false)) {
                      local_60 = uVar29;
                      _Var18 = Curl_pipeline_wanted(conn->data->multi,1);
                      if (_Var18) {
                        Curl_infof(data,
                                   "Rewinding stream by : %zu bytes on url %s (size = %ld, maxdownload = %ld, bytecount = %ld, nread = %zd)\n"
                                   ,local_60,(data->state).up.path,(data->req).size,
                                   (data->req).maxdownload,(data->req).bytecount,bytes_written);
                        conn->read_pos = conn->read_pos - local_60;
                        (conn->bits).stream_was_rewound = true;
                        uVar29 = local_60;
                      }
                      else {
                        Curl_infof(data,
                                   "Excess found in a non pipelined read: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld\n"
                                   ,local_60,(data->req).size,(data->req).maxdownload,
                                   (data->req).bytecount);
                        uVar29 = local_60;
                      }
                    }
                    bytes_written = (data->req).maxdownload - (data->req).bytecount;
                    if (bytes_written < 1) {
                      bytes_written = 0;
                    }
                    piVar2 = &(data->req).keepon;
                    *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                    local_40 = uVar29;
                  }
                }
                lVar23 = (data->req).bytecount + bytes_written;
                (data->req).bytecount = lVar23;
                Curl_pgrsSetDownloadCounter(data,lVar23);
                uVar29 = extraout_RDX_15;
                if (((data->req).chunk == false) &&
                   ((bytes_written != 0 ||
                    ((data->req).badheader != HEADER_NORMAL || (uVar34 & 1) != 0)))) {
                  if (((data->req).badheader != HEADER_NORMAL) && ((data->req).ignorebody == false))
                  {
                    sVar26 = (data->req).maxdownload;
                    if ((sVar26 == 0xffffffffffffffff) ||
                       ((long)(data->req).hbuflen <= (long)sVar26)) {
                      pcVar24 = (data->state).headerbuff;
                      sVar26 = (data->req).hbuflen;
                    }
                    else {
                      pcVar24 = (data->state).headerbuff;
                    }
                    CVar19 = Curl_client_write(conn,1,pcVar24,sVar26);
                    local_60 = CONCAT44(local_60._4_4_,1);
                    uVar29 = extraout_RDX_16;
                    if (CVar19 != CURLE_OK) goto LAB_00123952;
                    CVar19 = CURLE_OK;
                  }
                  if ((data->req).badheader < HEADER_ALLBAD) {
                    if (((conn->data->set).http_ce_skip == false) &&
                       (writer = (data->req).writer_stack, writer != (contenc_writer *)0x0)) {
                      if ((data->req).ignorebody == false) {
                        CVar19 = Curl_unencode_write(conn,writer,(data->req).str,bytes_written);
                        uVar29 = extraout_RDX_17;
                      }
                    }
                    else if ((data->req).ignorebody == false) {
                      pcVar24 = (data->req).str;
                      if ((conn->handler->protocol & 0xc000) == 0) {
                        CVar19 = Curl_client_write(conn,1,pcVar24,bytes_written);
                        uVar29 = extraout_RDX_21;
                      }
                      else {
                        CVar19 = Curl_pop3_write(conn,pcVar24,bytes_written);
                        uVar29 = extraout_RDX_18;
                      }
                    }
                  }
                  (data->req).badheader = HEADER_NORMAL;
                  local_60 = CONCAT44(local_60._4_4_,1);
                  if (CVar19 != CURLE_OK) goto LAB_00123952;
                  CVar19 = CURLE_OK;
                }
                goto LAB_00123b4c;
              }
              if ((data->req).newurl != (char *)0x0) {
                if ((conn->bits).close == true) {
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                  *local_50 = true;
                  local_64 = CURLE_OK;
                  goto LAB_00123b34;
                }
                (data->req).ignorebody = true;
                Curl_infof(data,"Ignoring the response-body\n");
              }
              lVar23 = (data->state).resume_from;
              if (((lVar23 == 0) || ((data->req).content_range != false)) ||
                 (((data->set).httpreq != HTTPREQ_GET || ((data->req).ignorebody != false)))) {
                if ((((data->set).timecondition == CURL_TIMECOND_NONE) ||
                    ((data->state).range != (char *)0x0)) ||
                   (_Var18 = Curl_meets_timecondition(data,(data->req).timeofdoc), _Var18))
                goto LAB_00123cda;
                *local_50 = true;
                (data->info).httpcode = 0x130;
                local_64 = CURLE_OK;
                Curl_infof(data,"Simulate a HTTP 304 response!\n");
                local_60 = CONCAT44(local_60._4_4_,1);
                Curl_conncontrol(conn,1);
                uVar29 = extraout_RDX_19;
              }
              else {
                if ((data->req).size != lVar23) {
                  Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume."
                            );
                  local_64 = CURLE_RANGE_ERROR;
                  uVar29 = extraout_RDX_22;
                  goto LAB_00123b34;
                }
                local_64 = CURLE_OK;
                Curl_infof(data,"The entire document is already downloaded");
                local_60 = CONCAT44(local_60._4_4_,1);
                Curl_conncontrol(conn,1);
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                *local_50 = true;
                uVar29 = extraout_RDX_20;
              }
            }
LAB_00123b3c:
            uVar34 = 1;
          }
        }
      }
      else {
        CVar19 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar26,&bytes_written);
        uVar29 = extraout_RDX_00;
        if (CVar19 == CURLE_OK) goto LAB_0012389e;
        uVar34 = 2;
        if (CVar19 != CURLE_AGAIN) {
LAB_00123952:
          uVar34 = 1;
          local_64 = CVar19;
        }
      }
LAB_00123974:
      if (uVar34 != 0) {
        if (uVar34 == 2) goto LAB_001241eb;
        nread = local_60 & 0xffffffff;
        done = local_50;
        CVar19 = local_64;
        goto LAB_00124243;
      }
      if (((conn->handler->protocol & 0x30) == 0) &&
         (_Var18 = Curl_ssl_data_pending(conn,0), uVar29 = extraout_RDX_03, !_Var18))
      goto LAB_001241eb;
      bVar35 = iVar20 != 0;
      iVar20 = iVar20 + -1;
    } while (bVar35);
    iVar20 = -1;
LAB_001241eb:
    done = local_50;
    if (iVar20 < 1) {
      conn->cselect_bits = 1;
      *local_38 = true;
    }
    nread = local_60 & 0xffffffff;
    CVar19 = CURLE_OK;
    if ((((data->req).keepon & 3U) == 2) && ((conn->bits).close == true)) {
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
      CVar19 = CURLE_OK;
    }
LAB_00124243:
    if (CVar19 != CURLE_OK) {
      return CVar19;
    }
    if (*done != false) {
      return CURLE_OK;
    }
  }
  if ((uVar33 & (data->req).keepon & 2) == 0) goto LAB_0012437f;
  if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
  }
  uVar33 = (uint)nread | 2;
  if ((data->req).upload_present == 0) {
    if ((data->state).ulbuf == (char *)0x0) {
      pcVar24 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size);
      (data->state).ulbuf = pcVar24;
      if (pcVar24 != (char *)0x0) goto LAB_001241b3;
      CVar19 = CURLE_OUT_OF_MEMORY;
      bVar35 = false;
    }
    else {
LAB_001241b3:
      CVar19 = CURLE_OK;
      bVar35 = true;
    }
    if (!bVar35) goto LAB_00124371;
    (data->req).upload_fromhere = (data->state).ulbuf;
    if ((data->req).upload_done == false) {
      pvVar9 = (data->req).protop;
      if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar9 + 0x218) == 2)) {
        (data->req).exp100 = EXP100_AWAITING_CONTINUE;
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
        cVar36 = Curl_now();
        (data->req).start100.tv_sec = cVar36.tv_sec;
        (data->req).start100.tv_usec = cVar36.tv_usec;
        uVar33 = (uint)nread & 0xfffffffd;
        bVar35 = false;
        Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
        iVar20 = 2;
        nread = (ulong)uVar33;
      }
      else {
        pCVar27 = conn->handler;
        if ((pCVar27->protocol & 0x40003) == 0) {
          bVar35 = false;
        }
        else {
          bVar35 = *(int *)((long)pvVar9 + 0x218) == 1;
        }
        CVar21 = Curl_fillreadbuffer(conn,(data->set).upload_buffer_size,(size_t *)&bytes_written);
        CVar19 = (CURLcode)pCVar27;
        if (CVar21 == CURLE_OK) {
          iVar20 = 0;
          nread = bytes_written;
        }
        else {
          iVar20 = 1;
          CVar19 = CVar21;
        }
      }
      if (iVar20 != 2) {
        if (iVar20 != 0) goto LAB_00124371;
        goto LAB_00124640;
      }
    }
    else {
      bVar35 = false;
      nread = 0;
LAB_00124640:
      if ((nread != 0) || (((data->req).keepon & 0x20) == 0)) {
        if ((long)nread < 1) {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
          if (((conn->bits).rewindaftersend != true) ||
             (CVar19 = Curl_readrewind(conn), CVar19 == CURLE_OK)) {
            CVar19 = CURLE_OK;
          }
          if (CVar19 == CURLE_OK) goto LAB_0012436f;
        }
        else {
          (data->req).upload_present = nread;
          if ((!bVar35) && (((data->set).prefer_ascii != false || ((data->set).crlf == true)))) {
            if ((data->state).scratch == (char *)0x0) {
              pcVar24 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size * 2);
              (data->state).scratch = pcVar24;
              if (pcVar24 == (char *)0x0) {
                Curl_failf(data,"Failed to alloc scratch buffer!");
                CVar19 = CURLE_OUT_OF_MEMORY;
                goto LAB_00124371;
              }
            }
            uVar29 = 1;
            if (1 < (long)nread) {
              uVar29 = nread;
            }
            uVar28 = 0;
            uVar32 = 0;
            do {
              cVar5 = (data->req).upload_fromhere[uVar28];
              pcVar24 = (data->state).scratch;
              if (cVar5 == '\n') {
                uVar1 = uVar32 + 1;
                pcVar24[uVar32] = '\r';
                (data->state).scratch[uVar32 + 1] = '\n';
                uVar32 = uVar1;
                if (((data->set).crlf == false) && (lVar23 = (data->state).infilesize, lVar23 != -1)
                   ) {
                  (data->state).infilesize = lVar23 + 1;
                }
              }
              else {
                pcVar24[uVar32] = cVar5;
              }
              uVar28 = uVar28 + 1;
              uVar32 = uVar32 + 1;
            } while (uVar29 != uVar28);
            if (uVar32 != nread) {
              (data->req).upload_fromhere = (data->state).scratch;
              (data->req).upload_present = uVar32;
              nread = uVar32;
            }
          }
          if (((conn->handler->protocol & 0x30000) == 0) ||
             (CVar19 = Curl_smtp_escape_eob(conn,nread), CVar19 == CURLE_OK)) goto LAB_001237b5;
        }
        goto LAB_00124371;
      }
    }
LAB_0012436f:
    CVar19 = CURLE_OK;
  }
  else {
LAB_001237b5:
    CVar19 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,
                        (data->req).upload_present,&bytes_written);
    if (CVar19 == CURLE_OK) {
      if ((data->set).verbose == true) {
        Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,bytes_written);
      }
      lVar23 = (data->req).writebytecount + bytes_written;
      (data->req).writebytecount = lVar23;
      if ((((data->req).upload_chunky != true) || ((data->req).forbidchunk == true)) &&
         (lVar23 == (data->state).infilesize)) {
        (data->req).upload_done = true;
        Curl_infof(data,"We are completely uploaded and fine\n");
      }
      lVar23 = (data->req).upload_present - bytes_written;
      if (lVar23 == 0) {
        if ((data->state).ulbuf == (char *)0x0) {
          pcVar24 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size);
          (data->state).ulbuf = pcVar24;
          if (pcVar24 != (char *)0x0) goto LAB_001242ff;
          CVar19 = CURLE_OUT_OF_MEMORY;
          bVar35 = false;
        }
        else {
LAB_001242ff:
          CVar19 = CURLE_OK;
          bVar35 = true;
        }
        if (!bVar35) goto LAB_00124371;
        (data->req).upload_fromhere = (data->state).ulbuf;
        (data->req).upload_present = 0;
        if ((data->req).upload_done == true) {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
          if (((conn->bits).rewindaftersend != true) ||
             (CVar19 = Curl_readrewind(conn), CVar19 == CURLE_OK)) {
            CVar19 = CURLE_OK;
          }
          if (CVar19 != CURLE_OK) goto LAB_00124371;
        }
      }
      else {
        (data->req).upload_present = lVar23;
        ppcVar4 = &(data->req).upload_fromhere;
        *ppcVar4 = *ppcVar4 + bytes_written;
      }
      Curl_pgrsSetUploadCounter(data,(data->req).writebytecount);
      goto LAB_0012436f;
    }
  }
LAB_00124371:
  nread = (ulong)uVar33;
  if (CVar19 != CURLE_OK) {
    return CVar19;
  }
LAB_0012437f:
  cVar36 = Curl_now();
  (data->req).now.tv_sec = cVar36.tv_sec;
  (data->req).now.tv_usec = cVar36.tv_usec;
  if ((int)nread == 0) {
    if (((data->req).exp100 == EXP100_AWAITING_CONTINUE) &&
       (uVar10 = (data->req).start100.tv_sec, uVar11 = (data->req).start100.tv_usec,
       older.tv_usec = uVar11, older.tv_sec = uVar10, newer._12_4_ = 0,
       newer.tv_sec = SUB128(cVar36._0_12_,0), newer.tv_usec = SUB124(cVar36._0_12_,8),
       older._12_4_ = 0, tVar25 = Curl_timediff(newer,older),
       (data->set).expect_100_timeout <= tVar25)) {
      (data->req).exp100 = EXP100_SEND_DATA;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 2;
      Curl_expire_done(data,EXPIRE_100_TIMEOUT);
      Curl_infof(data,"Done waiting for 100-continue\n");
    }
  }
  else {
    pcVar7 = (data->req).bytecountp;
    if (pcVar7 != (curl_off_t *)0x0) {
      *pcVar7 = (data->req).bytecount;
    }
    pcVar7 = (data->req).writebytecountp;
    if (pcVar7 != (curl_off_t *)0x0) {
      *pcVar7 = (data->req).writebytecount;
    }
  }
  iVar20 = Curl_pgrsUpdate(conn);
  CVar19 = CURLE_ABORTED_BY_CALLBACK;
  if (iVar20 == 0) {
    uVar12 = (data->req).now.tv_sec;
    uVar13 = (data->req).now.tv_usec;
    cVar36.tv_usec = uVar13;
    cVar36.tv_sec = uVar12;
    cVar36._12_4_ = 0;
    CVar19 = Curl_speedcheck(data,cVar36);
  }
  if (CVar19 == CURLE_OK) {
    if ((data->req).keepon == 0) {
      if ((data->set).opt_no_body == false) {
        lVar23 = (data->req).size;
        if ((((lVar23 != -1) && (lVar31 = (data->req).bytecount, lVar23 != lVar31)) &&
            (lVar31 != lVar23 + (data->state).crlf_conversions)) &&
           ((data->req).newurl == (char *)0x0)) {
          Curl_failf(data,"transfer closed with %ld bytes remaining to read");
          return CURLE_PARTIAL_FILE;
        }
        if (((data->req).chunk == true) && ((conn->chunk).state != CHUNK_STOP)) {
          Curl_failf(data,"transfer closed with outstanding read data remaining");
          return CURLE_PARTIAL_FILE;
        }
      }
      iVar20 = Curl_pgrsUpdate(conn);
      if (iVar20 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    else {
      tVar25 = Curl_timeleft(data,&(data->req).now,false);
      if (tVar25 < 0) {
        lVar23 = (data->req).size;
        uVar14 = (data->req).now.tv_sec;
        uVar15 = (data->req).now.tv_usec;
        newer_00.tv_usec = uVar15;
        newer_00.tv_sec = uVar14;
        uVar16 = (data->progress).t_startsingle.tv_sec;
        uVar17 = (data->progress).t_startsingle.tv_usec;
        older_00.tv_usec = uVar17;
        older_00.tv_sec = uVar16;
        newer_00._12_4_ = 0;
        older_00._12_4_ = 0;
        tVar25 = Curl_timediff(newer_00,older_00);
        cVar8 = (data->req).bytecount;
        if (lVar23 == -1) {
          Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",
                     tVar25,cVar8);
        }
        else {
          Curl_failf(data,
                     "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                     ,tVar25,cVar8,(data->req).size);
        }
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    *done = ((data->req).keepon & 0x33) == 0;
    return CURLE_OK;
  }
  return CVar19;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct Curl_easy *data,
                        bool *done,
                        bool *comeback)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat = 0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_check(fd_read, CURL_SOCKET_BAD, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done, comeback);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_now();
  if(didwhat) {
    /* Update read/write counters */
    if(k->bytecountp)
      *k->bytecountp = k->bytecount; /* read count */
    if(k->writebytecountp)
      *k->writebytecountp = k->writebytecount; /* write count */
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      timediff_t ms = Curl_timediff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        Curl_expire_done(data, EXPIRE_100_TIMEOUT);
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(k->now, data->progress.t_startsingle),
              k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(k->now, data->progress.t_startsingle),
              k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !k->newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read", k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    if(!(data->set.opt_no_body) && k->chunk &&
       (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}